

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

char * __thiscall Catch::StringRef::c_str(StringRef *this)

{
  ReusableStringStream RStack_38;
  string local_28;
  
  if (this->m_start[this->m_size] == '\0') {
    return this->m_start;
  }
  ReusableStringStream::ReusableStringStream(&RStack_38);
  std::__ostream_insert<char,std::char_traits<char>>
            (RStack_38.m_oss,"Called StringRef::c_str() on a non-null-terminated instance",0x3b);
  std::__cxx11::stringbuf::str();
  throw_domain_error(&local_28);
}

Assistant:

ITestCaseRegistry const &getTestCaseRegistry() const override {
                return m_testCaseRegistry;
            }